

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorprint.cc
# Opt level: O1

string * __thiscall
benchmark::FormatString_abi_cxx11_
          (string *__return_storage_ptr__,benchmark *this,char *msg,__va_list_tag *args)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  char *__s;
  va_list args_cp;
  char local_buff [256];
  allocator local_169;
  CheckHandler local_168;
  CheckHandler local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  char local_138 [264];
  
  local_148 = *(undefined8 *)(msg + 0x10);
  local_158 = *(undefined8 *)msg;
  uStack_150 = *(undefined8 *)(msg + 8);
  uVar1 = vsnprintf(local_138,0x100,(char *)this,&local_158);
  if ((int)uVar1 < 0) {
    internal::CheckHandler::CheckHandler
              (&local_160,"ret >= 0",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/colorprint.cc"
               ,"FormatString",0x5d);
  }
  else {
    internal::GetNullLogInstance();
  }
  if (-1 < (int)uVar1) {
    if (uVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else if (uVar1 < 0x100) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      sVar3 = strlen(local_138);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_138,local_138 + sVar3);
    }
    else {
      __s = (char *)operator_new__((ulong)(uVar1 + 1));
      uVar2 = vsnprintf(__s,(ulong)(uVar1 + 1),(char *)this,msg);
      if (uVar1 < uVar2 || (int)uVar2 < 1) {
        internal::CheckHandler::CheckHandler
                  (&local_168,"ret > 0 && ((size_t)ret) < size",
                   "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/colorprint.cc"
                   ,"FormatString",0x68);
        internal::CheckHandler::~CheckHandler(&local_168);
      }
      internal::GetNullLogInstance();
      std::__cxx11::string::string((string *)__return_storage_ptr__,__s,&local_169);
      operator_delete__(__s);
    }
    return __return_storage_ptr__;
  }
  internal::CheckHandler::~CheckHandler(&local_160);
}

Assistant:

std::string FormatString(const char *msg, va_list args) {
  // we might need a second shot at this, so pre-emptivly make a copy
  va_list args_cp;
  va_copy(args_cp, args);

  std::size_t size = 256;
  char local_buff[256];
  auto ret = std::vsnprintf(local_buff, size, msg, args_cp);

  va_end(args_cp);

  // currently there is no error handling for failure, so this is hack.
  CHECK(ret >= 0);

  if (ret == 0) // handle empty expansion
    return {};
  else if (static_cast<size_t>(ret) < size)
    return local_buff;
  else {
    // we did not provide a long enough buffer on our first attempt.
    size = (size_t)ret + 1; // + 1 for the null byte
    std::unique_ptr<char[]> buff(new char[size]);
    ret = std::vsnprintf(buff.get(), size, msg, args);
    CHECK(ret > 0 && ((size_t)ret) < size);
    return buff.get();
  }
}